

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorHori.cpp
# Opt level: O3

void __thiscall VECTOR_HORI_VERT::VectorHori::Output(VectorHori *this)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  long *plVar4;
  size_type *psVar5;
  uint i;
  ulong uVar6;
  ofstream fil;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228);
  Vector::get_filename_abi_cxx11_(&local_288,&this->super_Vector);
  std::ofstream::open((char *)&local_228,(_Ios_Openmode)local_288._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_228,(this->super_Vector).znak);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"*",1);
    uVar6 = 0;
    while( true ) {
      uVar2 = Vector::get_length(&this->super_Vector);
      if (uVar2 <= uVar6) break;
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)&local_228,(this->super_Vector).vector_[uVar6]);
      local_288._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_288,1);
      uVar6 = uVar6 + 1;
    }
    std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
    std::ostream::put((char)&local_228);
    std::ostream::flush();
    std::ofstream::close();
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  Vector::get_filename_abi_cxx11_(&local_268,&this->super_Vector);
  std::operator+(&local_248,"Error! Cannot open file ",&local_268);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_288._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_288._M_dataplus._M_p == psVar5) {
    local_288.field_2._M_allocated_capacity = *psVar5;
    local_288.field_2._8_8_ = plVar4[3];
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar5;
  }
  local_288._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_288);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void VectorHori::Output() const {
    std::ofstream fil;
    fil.open(this->get_filename().c_str(), std::ios_base::app);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + this->get_filename() + "!\n");
    }
    fil << this-> znak << "*";
    for (unsigned int i = 0; i < this->get_length(); i++) {
      fil << this->vector_[i] << ' ';
    }
    fil << std::endl;

    fil.close();
  }